

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O2

void __thiscall level_mesh::collect_mu_models(level_mesh *this,size_t num_mu_instances)

{
  pointer ppbVar1;
  uint16_t uVar2;
  long lVar3;
  b_model local_38;
  
  if (num_mu_instances != 0) {
    ppbVar1 = (this->m_instances).
              super__Vector_base<b_model_instance_*,_std::allocator<b_model_instance_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::
    __sort<__gnu_cxx::__normal_iterator<b_model_instance**,std::vector<b_model_instance*,std::allocator<b_model_instance*>>>,__gnu_cxx::__ops::_Iter_comp_iter<model_id_pred>>
              (ppbVar1,ppbVar1 + num_mu_instances);
    uVar2 = (*ppbVar1)->model_id;
    local_38.m_num_instances = 1;
    local_38.field_3.m_instances = (b_model_instance **)0x0;
    for (lVar3 = 8; num_mu_instances << 3 != lVar3; lVar3 = lVar3 + 8) {
      if (*(uint16_t *)(*(long *)((long)ppbVar1 + lVar3) + 4) != uVar2) {
        local_38.m_type = MT_MU_MODEL;
        local_38.m_locked = false;
        std::vector<b_model,_std::allocator<b_model>_>::emplace_back<b_model>
                  (&this->m_models,&local_38);
        uVar2 = *(uint16_t *)(*(long *)((long)ppbVar1 + lVar3) + 4);
        local_38.field_3.m_instances = (b_model_instance **)(lVar3 >> 3);
        local_38.m_num_instances = 0;
      }
      local_38.m_num_instances = local_38.m_num_instances + 1;
    }
    local_38.m_type = MT_MU_MODEL;
    local_38.m_locked = false;
    std::vector<b_model,_std::allocator<b_model>_>::emplace_back<b_model>(&this->m_models,&local_38)
    ;
  }
  return;
}

Assistant:

void level_mesh::collect_mu_models(size_t num_mu_instances)
{
	if (num_mu_instances) {
		b_model_instance_vec_it it0 = m_instances.begin(), it = it0, end = it + num_mu_instances;
		std::sort(it, end, model_id_pred());
		size_t num_instances = 1, instance0 = 0;
		for (uint16_t model_id = (*it++)->model_id; it != end; ++it, ++num_instances) {
			if ((*it)->model_id == model_id)
				continue;
			m_models.push_back(b_model(b_model::MT_MU_MODEL, num_instances, instance0));
			model_id = (*it)->model_id;
			instance0 = it - it0;
			num_instances = 0;
		}
		m_models.push_back(b_model(b_model::MT_MU_MODEL, num_instances, instance0));
	}
}